

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::break_stmt(analysis *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  analysis *in_RSI;
  NodePtr NVar2;
  undefined1 local_6d;
  int local_6c;
  string local_68;
  string local_48;
  
  local_6c = token::getLineno((in_RSI->tmp).
                              super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[6],int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->current_tab,(TreeNode **)this,
             (allocator<dh::TreeNode> *)&local_6d,(char (*) [6])"break",&local_6c);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"break","");
  match(in_RSI,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_6c = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,&local_6c);
  local_6c = 4;
  TreeNode::setKind(*(TreeNode **)this,&local_6c);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,";","");
  match(in_RSI,&local_68);
  _Var1._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
    _Var1._M_pi = extraout_RDX_00;
  }
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi
  ;
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::break_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in break_stmt\n";
#endif

	NodePtr ret = ::std::make_shared<TreeNode>("break",tmp->getLineno());
	match("break");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::BreakK);
	match(";");

	return ret;
}